

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O3

InterfacePortDef * __thiscall
kratos::InterfaceDefinition::port
          (InterfacePortDef *__return_storage_ptr__,InterfaceDefinition *this,string *name)

{
  const_iterator cVar1;
  mapped_type *pmVar2;
  UserException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  pointer local_68;
  size_type sStack_60;
  pointer local_58;
  size_type sStack_50;
  string local_48;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>_>_>_>
                  *)&this->ports_,name);
  if (cVar1._M_node != (_Base_ptr)&this->field_0x40) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>_>_>_>
             ::at(&this->ports_,name);
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
    ).
    super__Tuple_impl<1UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
    .super__Tuple_impl<2UL,_kratos::PortDirection,_kratos::PortType> =
         (pmVar2->
         super__Tuple_impl<0UL,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
         ).
         super__Tuple_impl<1UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
         .super__Tuple_impl<2UL,_kratos::PortDirection,_kratos::PortType>;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&(__return_storage_ptr__->
                super__Tuple_impl<0UL,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
                ).
                super__Tuple_impl<1UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
                .
                super__Head_base<1UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_false>
                ._M_head_impl,
               &(pmVar2->
                super__Tuple_impl<0UL,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
                ).
                super__Tuple_impl<1UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
                .
                super__Head_base<1UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_false>
                ._M_head_impl);
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
    ).super__Head_base<0UL,_unsigned_int,_false>._M_head_impl =
         (pmVar2->
         super__Tuple_impl<0UL,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
         ).super__Head_base<0UL,_unsigned_int,_false>._M_head_impl;
    return __return_storage_ptr__;
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  local_68 = (name->_M_dataplus)._M_p;
  sStack_60 = name->_M_string_length;
  local_58 = (this->name_)._M_dataplus._M_p;
  sStack_50 = (this->name_)._M_string_length;
  format_str.size_ = 0xdd;
  format_str.data_ = (char *)0x19;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_68;
  fmt::v7::detail::vformat_abi_cxx11_
            (&local_48,(detail *)"{0} does not exist in {1}",format_str,args);
  UserException::UserException(this_00,&local_48);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

InterfaceDefinition::InterfacePortDef InterfaceDefinition::port(const std::string& name) const {
    if (ports_.find(name) == ports_.end())
        throw UserException(::format("{0} does not exist in {1}", name, name_));
    return ports_.at(name);
}